

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O3

void __thiscall cppcms::plugin::signature_error::~signature_error(signature_error *this)

{
  pointer pcVar1;
  pointer ppvVar2;
  
  *(undefined ***)&this->super_bad_cast = &PTR__signature_error_0028a120;
  (this->super_bad_cast).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__signature_error_0028a148;
  pcVar1 = (this->msg_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->msg_).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_bad_cast).super_backtrace._vptr_backtrace = (_func_int **)&PTR__backtrace_002848d0;
  ppvVar2 = (this->super_bad_cast).super_backtrace.frames_.
            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (ppvVar2 != (pointer)0x0) {
    operator_delete(ppvVar2);
  }
  std::bad_cast::~bad_cast((bad_cast *)this);
  return;
}

Assistant:

signature_error::~signature_error() throw() {}